

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O0

int tcp4_echo_start(int port)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  undefined1 local_20 [4];
  int r;
  sockaddr_in addr;
  int port_local;
  
  addr.sin_zero._0_4_ = port;
  iVar1 = uv_ip4_addr("0.0.0.0",port,local_20);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/echo-server.c"
            ,0xe7,"0 == uv_ip4_addr(\"0.0.0.0\", port, &addr)");
    abort();
  }
  server = (uv_handle_t *)&tcpServer;
  serverType = TCP;
  iVar1 = uv_tcp_init(loop,&tcpServer);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_bind(&tcpServer,local_20,0);
    if (iVar1 == 0) {
      iVar1 = uv_listen(&tcpServer,0x1000,on_connection);
      __stream = _stderr;
      if (iVar1 == 0) {
        addr.sin_zero[4] = '\0';
        addr.sin_zero[5] = '\0';
        addr.sin_zero[6] = '\0';
        addr.sin_zero[7] = '\0';
      }
      else {
        uVar2 = uv_err_name(iVar1);
        fprintf(__stream,"Listen error %s\n",uVar2);
        addr.sin_zero[4] = '\x01';
        addr.sin_zero[5] = '\0';
        addr.sin_zero[6] = '\0';
        addr.sin_zero[7] = '\0';
      }
    }
    else {
      fprintf(_stderr,"Bind error\n");
      addr.sin_zero[4] = '\x01';
      addr.sin_zero[5] = '\0';
      addr.sin_zero[6] = '\0';
      addr.sin_zero[7] = '\0';
    }
  }
  else {
    fprintf(_stderr,"Socket creation error\n");
    addr.sin_zero[4] = '\x01';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
  }
  iVar1._0_1_ = addr.sin_zero[4];
  iVar1._1_1_ = addr.sin_zero[5];
  iVar1._2_1_ = addr.sin_zero[6];
  iVar1._3_1_ = addr.sin_zero[7];
  return iVar1;
}

Assistant:

static int tcp4_echo_start(int port) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", port, &addr));

  server = (uv_handle_t*)&tcpServer;
  serverType = TCP;

  r = uv_tcp_init(loop, &tcpServer);
  if (r) {
    /* TODO: Error codes */
    fprintf(stderr, "Socket creation error\n");
    return 1;
  }

  r = uv_tcp_bind(&tcpServer, (const struct sockaddr*) &addr, 0);
  if (r) {
    /* TODO: Error codes */
    fprintf(stderr, "Bind error\n");
    return 1;
  }

  r = uv_listen((uv_stream_t*)&tcpServer, SOMAXCONN, on_connection);
  if (r) {
    /* TODO: Error codes */
    fprintf(stderr, "Listen error %s\n", uv_err_name(r));
    return 1;
  }

  return 0;
}